

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::decodeLevel(Config *this,string *parameter)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  decode_level_set = true;
  bVar1 = std::operator==(parameter,"none");
  if (bVar1) {
    ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    decode_level = qpdf_dl_none;
  }
  else {
    bVar1 = std::operator==(parameter,"generalized");
    if (bVar1) {
      ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      decode_level = qpdf_dl_generalized;
    }
    else {
      bVar1 = std::operator==(parameter,"specialized");
      if (bVar1) {
        ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        decode_level = qpdf_dl_specialized;
      }
      else {
        bVar1 = std::operator==(parameter,"all");
        if (bVar1) {
          ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          decode_level = qpdf_dl_all;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_30,"invalid option",&local_31);
          usage(&local_30);
          std::__cxx11::string::~string((string *)&local_30);
        }
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::decodeLevel(std::string const& parameter)
{
    o.m->decode_level_set = true;
    if (parameter == "none") {
        o.m->decode_level = qpdf_dl_none;
    } else if (parameter == "generalized") {
        o.m->decode_level = qpdf_dl_generalized;
    } else if (parameter == "specialized") {
        o.m->decode_level = qpdf_dl_specialized;
    } else if (parameter == "all") {
        o.m->decode_level = qpdf_dl_all;
    } else {
        usage("invalid option");
    }
    return this;
}